

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

UAmbiguousConverter * ucnv_getAmbiguous(UConverter *cnv)

{
  UConverterGetName p_Var1;
  int iVar2;
  char *__s1;
  UConverterSharedData *pUVar3;
  long lVar4;
  
  if (cnv == (UConverter *)0x0) {
    return (UAmbiguousConverter *)0x0;
  }
  pUVar3 = cnv->sharedData;
  p_Var1 = pUVar3->impl->getName;
  if (p_Var1 != (UConverterGetName)0x0) {
    __s1 = (*p_Var1)(cnv);
    if (__s1 != (char *)0x0) goto LAB_0031fd6c;
    pUVar3 = cnv->sharedData;
  }
  __s1 = pUVar3->staticData->name;
LAB_0031fd6c:
  lVar4 = 0;
  do {
    iVar2 = strcmp(__s1,*(char **)((long)&ambiguousConverters[0].name + lVar4));
    if (iVar2 == 0) {
      return (UAmbiguousConverter *)((long)&ambiguousConverters[0].name + lVar4);
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0xb0);
  return (UAmbiguousConverter *)0x0;
}

Assistant:

static const UAmbiguousConverter *ucnv_getAmbiguous(const UConverter *cnv)
{
    UErrorCode errorCode;
    const char *name;
    int32_t i;

    if(cnv==NULL) {
        return NULL;
    }

    errorCode=U_ZERO_ERROR;
    name=ucnv_getName(cnv, &errorCode);
    if(U_FAILURE(errorCode)) {
        return NULL;
    }

    for(i=0; i<UPRV_LENGTHOF(ambiguousConverters); ++i)
    {
        if(0==uprv_strcmp(name, ambiguousConverters[i].name))
        {
            return ambiguousConverters+i;
        }
    }

    return NULL;
}